

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O1

void cf2_hintmask_read(CF2_HintMask hintmask,CF2_Buffer charstring,size_t bitCount)

{
  int *piVar1;
  FT_Byte *pFVar2;
  ulong uVar3;
  FT_Byte FVar4;
  
  if (bitCount < 0x61) {
    hintmask->bitCount = bitCount;
    hintmask->byteCount = bitCount + 7 >> 3;
    hintmask->isValid = '\x01';
    hintmask->isNew = '\x01';
    if ((bitCount != 0) && (hintmask->byteCount != 0)) {
      uVar3 = 0;
      do {
        pFVar2 = charstring->ptr;
        if (pFVar2 < charstring->end) {
          charstring->ptr = pFVar2 + 1;
          FVar4 = *pFVar2;
        }
        else {
          piVar1 = charstring->error;
          if ((piVar1 != (int *)0x0) && (*piVar1 == 0)) {
            *piVar1 = 0x55;
          }
          FVar4 = '\0';
        }
        hintmask->mask[uVar3] = FVar4;
        uVar3 = uVar3 + 1;
      } while (uVar3 < hintmask->byteCount);
    }
  }
  else {
    piVar1 = hintmask->error;
    if ((piVar1 != (int *)0x0) && (*piVar1 == 0)) {
      *piVar1 = 0x12;
      return;
    }
  }
  return;
}

Assistant:

static size_t
  cf2_hintmask_setCounts( CF2_HintMask  hintmask,
                          size_t        bitCount )
  {
    if ( bitCount > CF2_MAX_HINTS )
    {
      /* total of h and v stems must be <= 96 */
      CF2_SET_ERROR( hintmask->error, Invalid_Glyph_Format );
      return 0;
    }

    hintmask->bitCount  = bitCount;
    hintmask->byteCount = ( hintmask->bitCount + 7 ) / 8;

    hintmask->isValid = TRUE;
    hintmask->isNew   = TRUE;

    return bitCount;
  }